

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

void If_ManStop(If_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  Hash_IntMan_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *__ptr_01;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  If_Par_t *pIVar5;
  long lVar6;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  abctime time_03;
  abctime time_04;
  int iVar7;
  char *pcVar8;
  Vec_Int_t *__ptr_02;
  long lVar9;
  Vec_Str_t **ppVVar10;
  Vec_Mem_t **p_00;
  Vec_Int_t **ppVVar11;
  
  pIVar5 = p->pPars;
  pcVar8 = (char *)p;
  if (pIVar5->fVerbose != 0) {
    if (p->vCutData != (Vec_Int_t *)0x0) {
      If_ManCacheAnalize(p);
      pIVar5 = p->pPars;
      if (pIVar5->fVerbose == 0) goto LAB_0038fb11;
    }
    if (pIVar5->fTruth != 0) {
      uVar3 = (ulong)(uint)pIVar5->nLutSize;
      if (pIVar5->nLutSize < 7) {
        uVar3 = 6;
      }
      uVar4 = 0;
      for (lVar6 = 0; uVar3 - 5 != lVar6; lVar6 = lVar6 + 1) {
        uVar4 = (ulong)(uint)((int)uVar4 + p->vTtMem[lVar6 + 6]->nEntries);
      }
      iVar7 = 0;
      for (lVar6 = 0; uVar3 - 5 != lVar6; lVar6 = lVar6 + 1) {
        pVVar1 = p->vTtMem[lVar6 + 6];
        iVar7 = iVar7 + (int)((double)pVVar1->nPageAlloc * 8.0 +
                              (double)(pVVar1->iPage + 1) *
                              (double)(1 << ((byte)pVVar1->LogPageSze & 0x1f)) *
                              (double)pVVar1->nEntrySize * 8.0 + 48.0);
      }
      printf("Unique truth tables = %d   Memory = %.2f MB   ",(double)iVar7 * 9.5367431640625e-07,
             uVar4);
      pcVar8 = "Time";
      Abc_PrintTime(0x82525c,(char *)p->timeCache[4],time);
      iVar7 = p->nCacheMisses;
      if (iVar7 != 0) {
        printf("Cache hits = %d. Cache misses = %d  (%.2f %%)\n",
               ((double)iVar7 * 100.0) / (double)(p->nCacheHits + iVar7));
        Abc_PrintTime(0x7e7825,(char *)p->timeCache[0],time_00);
        Abc_PrintTime(0x7e7830,(char *)p->timeCache[1],time_01);
        Abc_PrintTime(0x7e783b,(char *)p->timeCache[2],time_02);
        Abc_PrintTime(0x7e7846,(char *)(p->timeCache[1] + p->timeCache[0] + p->timeCache[2]),time_03
                     );
        pcVar8 = "Canon     ";
        Abc_PrintTime(0x7e7851,(char *)p->timeCache[3],time_04);
      }
    }
  }
LAB_0038fb11:
  if ((p->pPars->fVerbose != 0) && (p->nCutsUselessAll != 0)) {
    for (uVar3 = 0; uVar3 != 0x11; uVar3 = uVar3 + 1) {
      if (p->nCutsUseless[uVar3] != 0) {
        iVar7 = 1;
        if (1 < p->nCutsCount[uVar3]) {
          iVar7 = p->nCutsCount[uVar3];
        }
        Abc_Print((int)pcVar8,"Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n",
                  ((double)p->nCutsUseless[uVar3] * 100.0) / (double)iVar7,uVar3 & 0xffffffff);
      }
    }
    iVar7 = 1;
    if (1 < p->nCutsCountAll) {
      iVar7 = p->nCutsCountAll;
    }
    Abc_Print((int)pcVar8,"Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n",
              ((double)p->nCutsUselessAll * 100.0) / (double)iVar7);
  }
  if (p->pIfDsdMan != (If_DsdMan_t *)0x0) {
    p->pIfDsdMan = (If_DsdMan_t *)0x0;
  }
  if (p->pPars->fUseDsd != 0) {
    if (p->nCountNonDec[0] != 0 || p->nCountNonDec[1] != 0) {
      printf("NonDec0 = %d.  NonDec1 = %d.\n");
    }
  }
  Vec_IntFreeP(&p->vCoAttrs);
  Vec_PtrFree(p->vCis);
  Vec_PtrFree(p->vCos);
  Vec_PtrFree(p->vObjs);
  Vec_PtrFree(p->vTemp);
  Vec_IntFreeP(&p->vCover);
  Vec_IntFreeP(&p->vArray);
  Vec_WrdFreeP(&p->vAnds);
  Vec_WrdFreeP(&p->vAndGate);
  Vec_WrdFreeP(&p->vOrGate);
  Vec_PtrFreeP(&p->vObjsRev);
  Vec_PtrFreeP(&p->vLatchOrder);
  Vec_IntFreeP(&p->vLags);
  Vec_IntFreeP(&p->vDump);
  ppVVar11 = p->vTtDsds + 6;
  uVar3 = 6;
  while( true ) {
    uVar2 = p->pPars->nLutSize;
    uVar4 = 6;
    if (6 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    if (uVar4 < uVar3) break;
    Vec_IntFreeP(ppVVar11);
    uVar3 = uVar3 + 1;
    ppVVar11 = ppVVar11 + 1;
  }
  ppVVar10 = p->vTtPerms + 6;
  uVar3 = 6;
  while( true ) {
    uVar4 = 6;
    if (6 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    if (uVar4 < uVar3) break;
    Vec_StrFreeP(ppVVar10);
    uVar3 = uVar3 + 1;
    uVar2 = p->pPars->nLutSize;
    ppVVar10 = ppVVar10 + 1;
  }
  ppVVar10 = p->vTtVars + 6;
  uVar3 = 6;
  while( true ) {
    uVar4 = 6;
    if (6 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    if (uVar4 < uVar3) break;
    Vec_StrFreeP(ppVVar10);
    uVar3 = uVar3 + 1;
    uVar2 = p->pPars->nLutSize;
    ppVVar10 = ppVVar10 + 1;
  }
  ppVVar11 = p->vTtDecs + 6;
  uVar3 = 6;
  while( true ) {
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 7) {
      uVar4 = 6;
    }
    if (uVar4 < uVar3) break;
    Vec_IntFreeP(ppVVar11);
    uVar3 = uVar3 + 1;
    uVar2 = p->pPars->nLutSize;
    ppVVar11 = ppVVar11 + 1;
  }
  Vec_IntFreeP(&p->vCutData);
  Vec_IntFreeP(&p->vPairRes);
  Vec_StrFreeP(&p->vPairPerms);
  Vec_PtrFreeP(&p->vVisited);
  __ptr = p->vPairHash;
  if (__ptr != (Hash_IntMan_t *)0x0) {
    Vec_IntFree(__ptr->vObjs);
    Vec_IntFree(__ptr->vTable);
    free(__ptr);
  }
  lVar6 = 0x8b;
  while( true ) {
    uVar2 = p->pPars->nLutSize;
    uVar3 = 6;
    if (6 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    if (uVar3 < lVar6 - 0x85U) break;
    Vec_MemHashFree(*(Vec_Mem_t **)(p->nObjs + lVar6 * 2 + -0x10));
    lVar6 = lVar6 + 1;
  }
  p_00 = p->vTtMem + 6;
  uVar3 = 6;
  while( true ) {
    uVar4 = 6;
    if (6 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    if (uVar4 < uVar3) break;
    Vec_MemFreeP(p_00);
    uVar3 = uVar3 + 1;
    uVar2 = p->pPars->nLutSize;
    p_00 = p_00 + 1;
  }
  uVar3 = 6;
  while( true ) {
    uVar4 = 6;
    if (6 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    if (uVar4 < uVar3) break;
    __ptr_00 = p->vTtIsops[uVar3];
    if (__ptr_00 != (Vec_Wec_t *)0x0) {
      __ptr_02 = __ptr_00->pArray;
      lVar6 = 8;
      for (lVar9 = 0; lVar9 < __ptr_00->nCap; lVar9 = lVar9 + 1) {
        __ptr_01 = *(void **)((long)&__ptr_02->nCap + lVar6);
        if (__ptr_01 != (void *)0x0) {
          free(__ptr_01);
          __ptr_02 = __ptr_00->pArray;
          *(undefined8 *)((long)&__ptr_02->nCap + lVar6) = 0;
        }
        lVar6 = lVar6 + 0x10;
      }
      free(__ptr_02);
      free(__ptr_00);
      p->vTtIsops[uVar3] = (Vec_Wec_t *)0x0;
      uVar2 = p->pPars->nLutSize;
    }
    uVar3 = uVar3 + 1;
  }
  ppVVar11 = p->vTtOccurs + 6;
  uVar3 = 6;
  while( true ) {
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 7) {
      uVar4 = 6;
    }
    if (uVar4 < uVar3) break;
    Vec_IntFreeP(ppVVar11);
    uVar3 = uVar3 + 1;
    uVar2 = p->pPars->nLutSize;
    ppVVar11 = ppVVar11 + 1;
  }
  Mem_FixedStop(p->pMemObj,0);
  if (p->vTtMem6 != (Vec_Mem_t *)0x0) {
    Vec_MemHashFree(p->vTtMem6);
    Vec_MemFreeP(&p->vTtMem6);
  }
  if (p->pMemCi != (If_Set_t *)0x0) {
    free(p->pMemCi);
    p->pMemCi = (If_Set_t *)0x0;
  }
  if (p->pMemAnd != (If_Set_t *)0x0) {
    free(p->pMemAnd);
    p->pMemAnd = (If_Set_t *)0x0;
  }
  if (p->puTemp[0] != (uint *)0x0) {
    free(p->puTemp[0]);
    p->puTemp[0] = (uint *)0x0;
  }
  if (p->puTempW != (word *)0x0) {
    free(p->puTempW);
    p->puTempW = (word *)0x0;
  }
  pIVar5 = p->pPars;
  if (pIVar5->pTimesArr != (float *)0x0) {
    free(pIVar5->pTimesArr);
    pIVar5 = p->pPars;
    pIVar5->pTimesArr = (float *)0x0;
  }
  if (pIVar5->pTimesReq != (float *)0x0) {
    free(pIVar5->pTimesReq);
    p->pPars->pTimesReq = (float *)0x0;
  }
  if (p->pManTim != (Tim_Man_t *)0x0) {
    Tim_ManStop(p->pManTim);
  }
  if (p->vSwitching != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vSwitching);
  }
  if (p->pPars->fUseBat != 0) {
    Bat_ManFuncSetdownTable();
  }
  if (p->pHashTable[0] != (void **)0x0) {
    free(p->pHashTable[0]);
    p->pHashTable[0] = (void **)0x0;
  }
  if (p->pHashTable[1] != (void **)0x0) {
    free(p->pHashTable[1]);
    p->pHashTable[1] = (void **)0x0;
  }
  if (p->pMemEntries != (Mem_Fixed_t *)0x0) {
    Mem_FixedStop(p->pMemEntries,0);
  }
  free(p->pName);
  free(p);
  return;
}

Assistant:

void If_ManStop( If_Man_t * p )
{
    extern void If_ManCacheAnalize( If_Man_t * p );
    int i;
    if ( p->pPars->fVerbose && p->vCutData )
        If_ManCacheAnalize( p );
    if ( p->pPars->fVerbose && p->pPars->fTruth )
    {
        int nUnique = 0, nMemTotal = 0;
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nUnique += Vec_MemEntryNum(p->vTtMem[i]);
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nMemTotal += (int)Vec_MemMemory(p->vTtMem[i]);
        printf( "Unique truth tables = %d   Memory = %.2f MB   ", nUnique, 1.0 * nMemTotal / (1<<20) ); 
        Abc_PrintTime( 1, "Time", p->timeCache[4] );
        if ( p->nCacheMisses )
        {
            printf( "Cache hits = %d. Cache misses = %d  (%.2f %%)\n", p->nCacheHits, p->nCacheMisses, 100.0 * p->nCacheMisses / (p->nCacheHits + p->nCacheMisses) ); 
            Abc_PrintTime( 1, "Non-DSD   ", p->timeCache[0] );
            Abc_PrintTime( 1, "DSD hits  ", p->timeCache[1] );
            Abc_PrintTime( 1, "DSD misses", p->timeCache[2] );
            Abc_PrintTime( 1, "TOTAL     ", p->timeCache[0] + p->timeCache[1] + p->timeCache[2] );
            Abc_PrintTime( 1, "Canon     ", p->timeCache[3] );
        }
    }
    if ( p->pPars->fVerbose && p->nCutsUselessAll )
    {
        for ( i = 0; i <= 16; i++ )
            if ( p->nCutsUseless[i] )
                Abc_Print( 1, "Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n", i, p->nCutsUseless[i], p->nCutsCount[i], 100.0*p->nCutsUseless[i]/Abc_MaxInt(p->nCutsCount[i],1) );
        Abc_Print( 1, "Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n", p->nCutsUselessAll, p->nCutsCountAll, 100.0*p->nCutsUselessAll/Abc_MaxInt(p->nCutsCountAll,1) );
    }
//    if ( p->pPars->fVerbose && p->nCuts5 )
//        Abc_Print( 1, "Statistics about 5-cuts: Total = %d  Non-decomposable = %d (%.2f %%)\n", p->nCuts5, p->nCuts5-p->nCuts5a, 100.0*(p->nCuts5-p->nCuts5a)/p->nCuts5 );
    if ( p->pIfDsdMan )
        p->pIfDsdMan = NULL;
    if ( p->pPars->fUseDsd && (p->nCountNonDec[0] || p->nCountNonDec[1]) )
        printf( "NonDec0 = %d.  NonDec1 = %d.\n", p->nCountNonDec[0], p->nCountNonDec[1] );
    Vec_IntFreeP( &p->vCoAttrs );
    Vec_PtrFree( p->vCis );
    Vec_PtrFree( p->vCos );
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vTemp );
    Vec_IntFreeP( &p->vCover );
    Vec_IntFreeP( &p->vArray );
    Vec_WrdFreeP( &p->vAnds );
    Vec_WrdFreeP( &p->vAndGate );
    Vec_WrdFreeP( &p->vOrGate );
    Vec_PtrFreeP( &p->vObjsRev );
    Vec_PtrFreeP( &p->vLatchOrder );
    Vec_IntFreeP( &p->vLags );
    Vec_IntFreeP( &p->vDump );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDsds[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtPerms[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtVars[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDecs[i] );
    Vec_IntFreeP( &p->vCutData );
    Vec_IntFreeP( &p->vPairRes );
    Vec_StrFreeP( &p->vPairPerms );
    Vec_PtrFreeP( &p->vVisited );
    if ( p->vPairHash )
        Hash_IntManStop( p->vPairHash );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemHashFree( p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemFreeP( &p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_WecFreeP( &p->vTtIsops[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtOccurs[i] );
    Mem_FixedStop( p->pMemObj, 0 );
    if ( p->vTtMem6 )
    {
        Vec_MemHashFree( p->vTtMem6 );
        Vec_MemFreeP( &p->vTtMem6 );
    }
    ABC_FREE( p->pMemCi );
    ABC_FREE( p->pMemAnd );
    ABC_FREE( p->puTemp[0] );
    ABC_FREE( p->puTempW );
    // free pars memory
    ABC_FREE( p->pPars->pTimesArr );
    ABC_FREE( p->pPars->pTimesReq );
    if ( p->pManTim )
        Tim_ManStop( p->pManTim );
    if ( p->vSwitching )
        Vec_IntFree( p->vSwitching );
    if ( p->pPars->fUseBat )
    {
        extern void Bat_ManFuncSetdownTable();
        Bat_ManFuncSetdownTable();
    }
    // hash table
//    if ( p->pPars->fVerbose && p->nTableEntries[0] )
//        printf( "Hash table 2:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[0], p->nTableSize[0] );
//    if ( p->pPars->fVerbose && p->nTableEntries[1] )
//        printf( "Hash table 3:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[1], p->nTableSize[1] );
    ABC_FREE( p->pHashTable[0] );
    ABC_FREE( p->pHashTable[1] );
    if ( p->pMemEntries )
        Mem_FixedStop( p->pMemEntries, 0 );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}